

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall gl4cts::GPUShaderFP64Test2::prepareShaderStages(GPUShaderFP64Test2 *this)

{
  ulong in_RAX;
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  *this_00;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (this->m_pDispatchCompute != (arbDispatchComputeFunc)0x0) {
    uStack_18 = in_RAX & 0xffffffff;
    std::
    vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
    ::emplace_back<gl4cts::GPUShaderFP64Test2::shaderStage>
              (&this->m_shader_stages,(shaderStage *)((long)&uStack_18 + 4));
  }
  this_00 = &this->m_shader_stages;
  uStack_18 = CONCAT44(1,(undefined4)uStack_18);
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::shaderStage>
            (this_00,(shaderStage *)((long)&uStack_18 + 4));
  uStack_18 = CONCAT44(2,(undefined4)uStack_18);
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::shaderStage>
            (this_00,(shaderStage *)((long)&uStack_18 + 4));
  uStack_18 = CONCAT44(3,(undefined4)uStack_18);
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::shaderStage>
            (this_00,(shaderStage *)((long)&uStack_18 + 4));
  uStack_18 = CONCAT44(4,(undefined4)uStack_18);
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::shaderStage>
            (this_00,(shaderStage *)((long)&uStack_18 + 4));
  uStack_18 = CONCAT44(5,(undefined4)uStack_18);
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::shaderStage>
            (this_00,(shaderStage *)((long)&uStack_18 + 4));
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareShaderStages()
{
	/* m_pDispatchCompute is initialized only if compute_shader are supproted and context is at least 4.2 */
	if (0 != m_pDispatchCompute)
	{
		m_shader_stages.push_back(COMPUTE_SHADER);
	}

	m_shader_stages.push_back(FRAGMENT_SHADER);
	m_shader_stages.push_back(GEOMETRY_SHADER);
	m_shader_stages.push_back(TESS_CTRL_SHADER);
	m_shader_stages.push_back(TESS_EVAL_SHADER);
	m_shader_stages.push_back(VERTEX_SHADER);
}